

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O2

void __thiscall
btDbvt::collideTTpersistentStack(btDbvt *this,btDbvtNode *root0,btDbvtNode *root1,ICollide *policy)

{
  long lVar1;
  sStkNN *psVar2;
  btDbvtNode *a;
  btDbvtNode *pbVar3;
  long lVar4;
  btDbvtNode *pbVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  sStkNN local_40;
  
  if (root1 != (btDbvtNode *)0x0 && root0 != (btDbvtNode *)0x0) {
    btAlignedObjectArray<btDbvt::sStkNN>::resize(&this->m_stkStack,0x80,&local_40);
    psVar2 = (this->m_stkStack).m_data;
    psVar2->a = root0;
    psVar2->b = root1;
    iVar9 = 1;
    iVar7 = 0x7c;
    do {
      lVar8 = (long)iVar9;
      iVar10 = iVar9 + -1;
      lVar1 = lVar8 + -1;
      psVar2 = (this->m_stkStack).m_data;
      a = psVar2[lVar1].a;
      pbVar3 = psVar2[lVar1].b;
      if (iVar7 < iVar10) {
        btAlignedObjectArray<btDbvt::sStkNN>::resize
                  (&this->m_stkStack,(this->m_stkStack).m_size * 2,&local_40);
        iVar7 = (this->m_stkStack).m_size + -4;
      }
      if (a == pbVar3) {
        if (*(long *)((long)&a->field_2 + 8) != 0) {
          pbVar3 = (a->field_2).childs[0];
          psVar2 = (this->m_stkStack).m_data;
          psVar2[lVar1].a = pbVar3;
          psVar2[lVar1].b = pbVar3;
          pbVar3 = *(btDbvtNode **)((long)&a->field_2 + 8);
          psVar2 = (this->m_stkStack).m_data;
          psVar2[lVar8].a = pbVar3;
          psVar2[lVar8].b = pbVar3;
          pbVar3 = *(btDbvtNode **)((long)&a->field_2 + 8);
          psVar2 = (this->m_stkStack).m_data + lVar8 + 1;
          psVar2->a = (a->field_2).childs[0];
          psVar2->b = pbVar3;
          iVar10 = iVar9 + 2;
        }
      }
      else {
        bVar6 = Intersect(&a->volume,&pbVar3->volume);
        if (bVar6) {
          lVar4 = *(long *)((long)&pbVar3->field_2 + 8);
          if (*(long *)((long)&a->field_2 + 8) == 0) {
            if (lVar4 == 0) {
              (*policy->_vptr_ICollide[2])(policy,a,pbVar3);
            }
            else {
              pbVar5 = (pbVar3->field_2).childs[0];
              psVar2 = (this->m_stkStack).m_data;
              psVar2[lVar1].a = a;
              psVar2[lVar1].b = pbVar5;
              pbVar3 = *(btDbvtNode **)((long)&pbVar3->field_2 + 8);
              psVar2 = (this->m_stkStack).m_data;
              psVar2[lVar8].a = a;
              psVar2[lVar8].b = pbVar3;
              iVar10 = iVar9 + 1;
            }
          }
          else if (lVar4 == 0) {
            psVar2 = (this->m_stkStack).m_data;
            psVar2[lVar1].a = (a->field_2).childs[0];
            psVar2[lVar1].b = pbVar3;
            psVar2 = (this->m_stkStack).m_data;
            psVar2[lVar8].a = *(btDbvtNode **)((long)&a->field_2 + 8);
            psVar2[lVar8].b = pbVar3;
            iVar10 = iVar9 + 1;
          }
          else {
            pbVar5 = (pbVar3->field_2).childs[0];
            psVar2 = (this->m_stkStack).m_data;
            psVar2[lVar1].a = (a->field_2).childs[0];
            psVar2[lVar1].b = pbVar5;
            pbVar5 = (pbVar3->field_2).childs[0];
            psVar2 = (this->m_stkStack).m_data;
            psVar2[lVar8].a = *(btDbvtNode **)((long)&a->field_2 + 8);
            psVar2[lVar8].b = pbVar5;
            pbVar5 = *(btDbvtNode **)((long)&pbVar3->field_2 + 8);
            psVar2 = (this->m_stkStack).m_data;
            psVar2[lVar8 + 1].a = (a->field_2).childs[0];
            psVar2[lVar8 + 1].b = pbVar5;
            pbVar3 = *(btDbvtNode **)((long)&pbVar3->field_2 + 8);
            psVar2 = (this->m_stkStack).m_data;
            psVar2[lVar8 + 2].a = *(btDbvtNode **)((long)&a->field_2 + 8);
            psVar2[lVar8 + 2].b = pbVar3;
            iVar10 = iVar9 + 3;
          }
        }
      }
      iVar9 = iVar10;
    } while (iVar9 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTTpersistentStack(	const btDbvtNode* root0,
								  const btDbvtNode* root1,
								  DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root0&&root1)
		{
			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-4;
			
			m_stkStack.resize(DOUBLE_STACKSIZE);
			m_stkStack[0]=sStkNN(root0,root1);
			do	{		
				sStkNN	p=m_stkStack[--depth];
				if(depth>treshold)
				{
					m_stkStack.resize(m_stkStack.size()*2);
					treshold=m_stkStack.size()-4;
				}
				if(p.a==p.b)
				{
					if(p.a->isinternal())
					{
						m_stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[0]);
						m_stkStack[depth++]=sStkNN(p.a->childs[1],p.a->childs[1]);
						m_stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[1]);
					}
				}
				else if(Intersect(p.a->volume,p.b->volume))
				{
					if(p.a->isinternal())
					{
						if(p.b->isinternal())
						{
							m_stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[0]);
							m_stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[0]);
							m_stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[1]);
							m_stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[1]);
						}
						else
						{
							m_stkStack[depth++]=sStkNN(p.a->childs[0],p.b);
							m_stkStack[depth++]=sStkNN(p.a->childs[1],p.b);
						}
					}
					else
					{
						if(p.b->isinternal())
						{
							m_stkStack[depth++]=sStkNN(p.a,p.b->childs[0]);
							m_stkStack[depth++]=sStkNN(p.a,p.b->childs[1]);
						}
						else
						{
							policy.Process(p.a,p.b);
						}
					}
				}
			} while(depth);
		}
}